

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeFunctionType(Builder *this,Id returnType,Vector<Id> *paramTypes)

{
  Id IVar1;
  int iVar2;
  Id IVar3;
  size_type sVar4;
  reference ppIVar5;
  const_reference pvVar6;
  Instruction *pIVar7;
  undefined4 in_register_00000034;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_58;
  int local_50;
  int p_1;
  int local_3c;
  byte local_35;
  int p;
  bool mismatch;
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  Vector<Id> *paramTypes_local;
  Builder *pBStack_18;
  Id returnType_local;
  Builder *this_local;
  
  size = CONCAT44(in_register_00000034,returnType);
  p = 0;
  type = (Instruction *)paramTypes;
  paramTypes_local._4_4_ = returnType;
  pBStack_18 = this;
  do {
    iVar2 = p;
    sVar4 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
            size(this->groupedTypes + 0x21);
    if ((int)sVar4 <= iVar2) {
      pIVar7 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
      IVar1 = getUniqueId(this);
      Instruction::Instruction(pIVar7,IVar1,0,OpTypeFunction);
      pIStack_30 = pIVar7;
      Instruction::addIdOperand(pIVar7,paramTypes_local._4_4_);
      for (local_50 = 0; iVar2 = local_50,
          sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                             type), pIVar7 = pIStack_30, iVar2 < (int)sVar4; local_50 = local_50 + 1
          ) {
        pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                 operator[]((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                            type,(long)local_50);
        Instruction::addIdOperand(pIVar7,*pvVar6);
      }
      std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
      push_back(this->groupedTypes + 0x21,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_58,
                 pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)&local_58);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_58);
      Module::mapInstruction(&this->module,pIStack_30);
      IVar1 = Instruction::getResultId(pIStack_30);
      return IVar1;
    }
    ppIVar5 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              operator[](this->groupedTypes + 0x21,(long)p);
    pIStack_30 = *ppIVar5;
    size = 0;
    IVar1 = Instruction::getIdOperand(pIStack_30,0);
    if (IVar1 == paramTypes_local._4_4_) {
      sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)type
                        );
      iVar2 = Instruction::getNumOperands(pIStack_30);
      if ((int)sVar4 == iVar2 + -1) {
        local_35 = 0;
        for (local_3c = 0; iVar2 = local_3c,
            sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                *)type), iVar2 < (int)sVar4; local_3c = local_3c + 1) {
          pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                   operator[]((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *
                              )type,(long)local_3c);
          IVar1 = *pvVar6;
          size = (size_t)(local_3c + 1U);
          IVar3 = Instruction::getIdOperand(pIStack_30,local_3c + 1U);
          if (IVar1 != IVar3) {
            local_35 = 1;
            break;
          }
        }
        if ((local_35 & 1) == 0) {
          IVar1 = Instruction::getResultId(pIStack_30);
          return IVar1;
        }
      }
    }
    p = p + 1;
  } while( true );
}

Assistant:

Id Builder::makeFunctionType(Id returnType, const dxil_spv::Vector<Id>& paramTypes)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeFunction].size(); ++t) {
        type = groupedTypes[OpTypeFunction][t];
        if (type->getIdOperand(0) != returnType || (int)paramTypes.size() != type->getNumOperands() - 1)
            continue;
        bool mismatch = false;
        for (int p = 0; p < (int)paramTypes.size(); ++p) {
            if (paramTypes[p] != type->getIdOperand(p + 1)) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeFunction);
    type->addIdOperand(returnType);
    for (int p = 0; p < (int)paramTypes.size(); ++p)
        type->addIdOperand(paramTypes[p]);
    groupedTypes[OpTypeFunction].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}